

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalType *
duckdb::LogicalType::ForceMaxLogicalType
          (LogicalType *__return_storage_ptr__,LogicalType *left,LogicalType *right)

{
  bool bVar1;
  idx_t iVar2;
  idx_t iVar3;
  LogicalType result;
  LogicalType LStack_38;
  
  LogicalType(&LStack_38);
  bVar1 = TryGetMaxLogicalTypeInternal<duckdb::ForceGetTypeOperation>(left,right,&LStack_38);
  if (bVar1) {
    LogicalType(__return_storage_ptr__,&LStack_38);
  }
  else {
    iVar2 = GetLogicalTypeScore(left);
    iVar3 = GetLogicalTypeScore(right);
    if ((uint)iVar2 < (uint)iVar3) {
      left = right;
    }
    LogicalType(__return_storage_ptr__,left);
  }
  ~LogicalType(&LStack_38);
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::ForceMaxLogicalType(const LogicalType &left, const LogicalType &right) {
	LogicalType result;
	if (TryGetMaxLogicalTypeInternal<ForceGetTypeOperation>(left, right, result)) {
		return result;
	}
	// we prefer the type with the highest score
	auto left_score = GetLogicalTypeScore(left);
	auto right_score = GetLogicalTypeScore(right);
	if (left_score < right_score) {
		return right;
	} else {
		return left;
	}
}